

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clistats.cpp
# Opt level: O0

bool __thiscall DynamicHistogram<double>::add(DynamicHistogram<double> *this,double value)

{
  bool bVar1;
  bool bVar2;
  double dValue;
  double value_local;
  DynamicHistogram<double> *this_local;
  
  if ((this->_enabled & 1U) == 0) {
    this_local._7_1_ = false;
  }
  else {
    bVar2 = this->_initialized;
    bVar1 = contains_(this,value);
    if ((bVar2 & 1U & bVar1) == 0) {
      bVar2 = FixedSizeCache<double>::full(&this->_cache);
      if (bVar2) {
        (*this->_vptr_DynamicHistogram[2])();
      }
      bVar2 = contains_(this,value);
      if (!bVar2) {
        FixedSizeCache<double>::add(&this->_cache,value);
        return false;
      }
    }
    add_(this,value);
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool
    add(T const value)
    {
    
        if (!this->_enabled) return false;

        double dValue = (double) value;

        /* Add new data to cache if histogram is uninitialized or not within its bounds */
        if (!(this->_initialized & this->contains_(dValue)))
        {
            /* If cache is full then merge the cache and the histogram first */
            if (this->_cache.full())
            {
                this->merge();
            }

            /* Update cache if new value is not in merged histogram */
            if (!this->contains_(dValue))
            {
                this->_cache.add(dValue);
                return false;
            }
        }

        /* Add new data to existing histogram */
        this->add_(dValue);

        return true;

    }